

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MagneticField.cpp
# Opt level: O0

void __thiscall OpenMD::MagneticField::modifyForces(MagneticField *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  long in_RDI;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  bool isCharge;
  Mat3x3d I;
  Vector3d omega;
  Vector3d AngMomentum;
  Vector3d D;
  Vector3d t;
  Vector3d r;
  Vector3d f;
  Vector3d v;
  RealType C;
  int n;
  int m;
  int l;
  AtomType *atype;
  Atom *atom;
  Molecule *mol;
  AtomIterator j;
  MoleculeIterator i;
  Molecule *in_stack_fffffffffffffc38;
  Atom *in_stack_fffffffffffffc40;
  StuntDouble *in_stack_fffffffffffffc48;
  StuntDouble *in_stack_fffffffffffffc50;
  iterator *in_stack_fffffffffffffc58;
  SimInfo *in_stack_fffffffffffffc60;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffc68;
  uint in_stack_fffffffffffffca0;
  undefined2 in_stack_fffffffffffffca4;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  Vector3<double> *in_stack_fffffffffffffca8;
  MagneticField *in_stack_fffffffffffffcc0;
  SquareMatrix3<double> *in_stack_fffffffffffffd08;
  undefined1 local_298 [192];
  MultipoleAdapter local_1d8 [10];
  FixedChargeAdapter local_188 [9];
  byte local_139;
  RectMatrix<double,_3U,_3U> local_138;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8 [6];
  Vector3<double> *local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  AtomType *local_30;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    initialize(in_stack_fffffffffffffcc0);
  }
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x1f3619);
  Vector3<double>::Vector3((Vector3<double> *)0x1f3626);
  Vector3<double>::Vector3((Vector3<double> *)0x1f3633);
  Vector3<double>::Vector3((Vector3<double> *)0x1f3640);
  Vector3<double>::Vector3((Vector3<double> *)0x1f364d);
  Vector3<double>::Vector3((Vector3<double> *)0x1f365a);
  Vector3<double>::Vector3((Vector3<double> *)0x1f3667);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1f3674);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    local_20 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffc60,(MoleculeIterator *)in_stack_fffffffffffffc58);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58
                                    );
      while (local_28 != (Atom *)0x0) {
        local_139 = 0;
        local_48 = (Vector3<double> *)0x0;
        local_30 = Atom::getAtomType(local_28);
        StuntDouble::getPos(in_stack_fffffffffffffc48);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffc40,
                   (Vector3<double> *)in_stack_fffffffffffffc38);
        StuntDouble::getVel(in_stack_fffffffffffffc48);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffc40,
                   (Vector3<double> *)in_stack_fffffffffffffc38);
        FixedChargeAdapter::FixedChargeAdapter(local_188,local_30);
        bVar3 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1f37c1);
        if (bVar3) {
          local_139 = 1;
          in_stack_fffffffffffffca8 =
               (Vector3<double> *)
               FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_fffffffffffffc40);
          local_48 = in_stack_fffffffffffffca8;
        }
        local_48 = (Vector3<double> *)((double)local_48 * 23.0609);
        if ((local_139 & 1) != 0) {
          cross<double>(in_stack_fffffffffffffca8,
                        (Vector3<double> *)
                        CONCAT17(in_stack_fffffffffffffca7,
                                 CONCAT16(in_stack_fffffffffffffca6,
                                          CONCAT24(in_stack_fffffffffffffca4,
                                                   in_stack_fffffffffffffca0))));
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffc48,
                            (double)in_stack_fffffffffffffc40);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffc48,
                            (double)in_stack_fffffffffffffc40);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc48,
                     (Vector<double,_3U> *)in_stack_fffffffffffffc40);
          StuntDouble::addFrc(in_stack_fffffffffffffc50,(Vector3d *)in_stack_fffffffffffffc48);
        }
        MultipoleAdapter::MultipoleAdapter(local_1d8,local_30);
        in_stack_fffffffffffffca7 =
             MultipoleAdapter::isDipole((MultipoleAdapter *)in_stack_fffffffffffffca8);
        if ((bool)in_stack_fffffffffffffca7) {
          StuntDouble::getDipole(in_stack_fffffffffffffc48);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffc48,
                            (double)in_stack_fffffffffffffc40);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc48,
                     (Vector<double,_3U> *)in_stack_fffffffffffffc40);
          cross<double>(in_stack_fffffffffffffca8,
                        (Vector3<double> *)
                        CONCAT17(in_stack_fffffffffffffca7,
                                 CONCAT16(in_stack_fffffffffffffca6,
                                          CONCAT24(in_stack_fffffffffffffca4,
                                                   in_stack_fffffffffffffca0))));
          cross<double>(in_stack_fffffffffffffca8,
                        (Vector3<double> *)
                        CONCAT17(in_stack_fffffffffffffca7,
                                 CONCAT16(in_stack_fffffffffffffca6,
                                          CONCAT24(in_stack_fffffffffffffca4,
                                                   in_stack_fffffffffffffca0))));
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc40,
                     (Vector3<double> *)in_stack_fffffffffffffc38);
          StuntDouble::addTrq(in_stack_fffffffffffffc50,(Vector3d *)in_stack_fffffffffffffc48);
          StuntDouble::getJ(in_stack_fffffffffffffc48);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc40,
                     (Vector3<double> *)in_stack_fffffffffffffc38);
          (*(local_28->super_StuntDouble)._vptr_StuntDouble[5])(local_298);
          SquareMatrix3<double>::operator=
                    ((SquareMatrix3<double> *)in_stack_fffffffffffffc40,
                     (SquareMatrix3<double> *)in_stack_fffffffffffffc38);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f3a33);
          in_stack_fffffffffffffca6 = StuntDouble::isLinear(&local_28->super_StuntDouble);
          if ((bool)in_stack_fffffffffffffca6) {
            in_stack_fffffffffffffca0 = StuntDouble::linearAxis(&local_28->super_StuntDouble);
            local_38 = in_stack_fffffffffffffca0 + 1 +
                       ((int)(in_stack_fffffffffffffca0 + 1) / 3) * -3;
            local_3c = in_stack_fffffffffffffca0 + 2 +
                       ((int)(in_stack_fffffffffffffca0 + 2) / 3) * -3;
            local_34 = in_stack_fffffffffffffca0;
            pdVar4 = Vector<double,_3U>::operator[](&local_f0,in_stack_fffffffffffffca0);
            *pdVar4 = 0.0;
            pdVar4 = Vector<double,_3U>::operator[](local_d8,local_38);
            dVar1 = *pdVar4;
            pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_138,local_38,local_38);
            dVar2 = *pdVar4;
            pdVar4 = Vector<double,_3U>::operator[](&local_f0,local_38);
            *pdVar4 = dVar1 / dVar2;
            in_stack_fffffffffffffc68 =
                 (RectMatrix<double,_3U,_3U> *)Vector<double,_3U>::operator[](local_d8,local_3c);
            in_stack_fffffffffffffc58 = (iterator *)in_stack_fffffffffffffc68->data_[0][0];
            in_stack_fffffffffffffc60 =
                 (SimInfo *)RectMatrix<double,_3U,_3U>::operator()(&local_138,local_3c,local_3c);
            in_stack_fffffffffffffc48 =
                 (StuntDouble *)
                 ((double)in_stack_fffffffffffffc58 /
                 (double)in_stack_fffffffffffffc60->_vptr_SimInfo);
            in_stack_fffffffffffffc50 =
                 (StuntDouble *)Vector<double,_3U>::operator[](&local_f0,local_3c);
            in_stack_fffffffffffffc50->_vptr_StuntDouble = (_func_int **)in_stack_fffffffffffffc48;
          }
          else {
            SquareMatrix3<double>::inverse(in_stack_fffffffffffffd08);
            OpenMD::operator*(in_stack_fffffffffffffc68,
                              (Vector<double,_3U> *)in_stack_fffffffffffffc60);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffffc48,
                       (Vector<double,_3U> *)in_stack_fffffffffffffc40);
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f3ca2);
          }
          cross<double>(in_stack_fffffffffffffca8,
                        (Vector3<double> *)
                        CONCAT17(in_stack_fffffffffffffca7,
                                 CONCAT16(in_stack_fffffffffffffca6,
                                          CONCAT24(in_stack_fffffffffffffca4,
                                                   in_stack_fffffffffffffca0))));
          cross<double>(in_stack_fffffffffffffca8,
                        (Vector3<double> *)
                        CONCAT17(in_stack_fffffffffffffca7,
                                 CONCAT16(in_stack_fffffffffffffca6,
                                          CONCAT24(in_stack_fffffffffffffca4,
                                                   in_stack_fffffffffffffca0))));
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc40,
                     (Vector3<double> *)in_stack_fffffffffffffc38);
          StuntDouble::addFrc(in_stack_fffffffffffffc50,(Vector3d *)in_stack_fffffffffffffc48);
        }
        in_stack_fffffffffffffc40 =
             Molecule::nextAtom((Molecule *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        local_28 = in_stack_fffffffffffffc40;
      }
      in_stack_fffffffffffffc38 =
           SimInfo::nextMolecule
                     (in_stack_fffffffffffffc60,(MoleculeIterator *)in_stack_fffffffffffffc58);
      local_20 = in_stack_fffffffffffffc38;
    }
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f3dad);
  return;
}

Assistant:

void MagneticField::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;

    int l, m, n;
    RealType C;
    Vector3d v;
    Vector3d f;
    Vector3d r;
    Vector3d t;
    Vector3d D;
    Vector3d AngMomentum;
    Vector3d omega;
    Mat3x3d I;
    bool isCharge;

    if (doMagneticField) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();
          r     = atom->getPos();
          v     = atom->getVel();

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          C *= Constants::chargeFieldConvert;

          if (isCharge) {
            f = cross(v, MF) * C * Constants::magneticFieldConvert;
            atom->addFrc(f);
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            t = cross(D, cross(v, MF));
            atom->addTrq(t);

            AngMomentum = atom->getJ();
            I           = atom->getI();
            if (atom->isLinear()) {
              l        = atom->linearAxis();
              m        = (l + 1) % 3;
              n        = (l + 2) % 3;
              omega[l] = 0;
              omega[m] = AngMomentum[m] / I(m, m);
              omega[n] = AngMomentum[n] / I(n, n);
            } else {
              omega = I.inverse() * AngMomentum;
            }

            f = cross(cross(omega, D), MF);
            atom->addFrc(f);
          }
        }
      }
    }
  }